

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O1

coord * gettrack(int x,int y)

{
  int iVar1;
  uint uVar2;
  coord *pcVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  if (utcnt != 0) {
    pcVar3 = utrack + utpnt;
    iVar4 = utcnt;
    do {
      iVar4 = iVar4 + -1;
      bVar6 = pcVar3 == utrack;
      pcVar3 = pcVar3 + -1;
      if (bVar6) {
        pcVar3 = utrack + 0x31;
      }
      iVar1 = distmin(x,y,(int)pcVar3->x,(int)pcVar3->y);
      if (iVar1 < 3) {
        if (iVar1 != 2) {
          if (iVar1 == 0) {
            return (coord *)0x0;
          }
          return pcVar3;
        }
      }
      else {
        uVar2 = iVar1 - 2;
        iVar5 = iVar4 - uVar2;
        if (iVar5 == 0 || iVar4 < (int)uVar2) {
          return (coord *)0x0;
        }
        iVar4 = iVar5;
        if (pcVar3 < utrack + uVar2) {
          pcVar3 = pcVar3 + (0x34 - iVar1);
        }
        else {
          pcVar3 = pcVar3 + -(ulong)uVar2;
        }
      }
    } while (iVar4 != 0);
  }
  return (coord *)0x0;
}

Assistant:

coord *gettrack(int x, int y)
{
    int cnt, ndist;
    coord *tc;
    cnt = utcnt;
    for (tc = &utrack[utpnt]; cnt--; ){
	if (tc == utrack) tc = &utrack[UTSZ-1];
	else tc--;
	ndist = distmin(x,y,tc->x,tc->y);

	/* if far away, skip track entries til we're closer */
	if (ndist > 2) {
	    ndist -= 2; /* be careful due to extra decrement at top of loop */
	    cnt -= ndist;
	    if (cnt <= 0)
		return NULL; /* too far away, no matches possible */
	    if (tc < &utrack[ndist])
		tc += (UTSZ-ndist);
	    else
		tc -= ndist;
	} else if (ndist <= 1)
	    return ndist ? tc : 0;
    }
    return NULL;
}